

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O3

uint64_t __thiscall DnsStats::GetLeaksRef(DnsStats *this)

{
  bool bVar1;
  DnsHashEntry *pDVar2;
  long lVar3;
  bool bVar4;
  uint64_t uVar5;
  DnsHashEntry key;
  DnsHashEntry local_90;
  
  DnsHashEntry::DnsHashEntry(&local_90);
  lVar3 = 0;
  uVar5 = 0;
  bVar1 = true;
  do {
    bVar4 = bVar1;
    local_90.count = 0;
    local_90.hash = 0;
    local_90.registry_id = 0x1b;
    local_90.key_type = 0;
    local_90.key_length = 4;
    local_90.field_6.key_number = (&DAT_00183380)[lVar3];
    pDVar2 = BinHash<DnsHashEntry>::Retrieve(&this->hashTable,&local_90);
    if (pDVar2 != (DnsHashEntry *)0x0) {
      uVar5 = uVar5 + pDVar2->count;
    }
    lVar3 = 1;
    bVar1 = false;
  } while (bVar4);
  DnsHashEntry::~DnsHashEntry(&local_90);
  return uVar5;
}

Assistant:

uint64_t DnsStats::GetLeaksRef()
{
    DnsHashEntry key;
    DnsHashEntry * r_key;
    uint64_t leaks_ref = 0;
    const uint32_t rcode[2] = { DNS_RCODE_NXDOMAIN, DNS_RCODE_NOERROR };

    for (int i = 0; i < 2; i++) {
        key.count = 0;
        key.hash = 0;
        key.registry_id = REGISTRY_DNS_root_QR;
        key.key_length = sizeof(uint32_t);
        key.key_type = 0; /* number */
        key.key_number = rcode[i];

        r_key = (DnsHashEntry*)hashTable.Retrieve(&key);
        if (r_key != NULL) {
            leaks_ref += r_key->count;
        }
    }

    return leaks_ref;
}